

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManSupports(Aig_Man_t *pMan)

{
  uint *puVar1;
  Part_One_t *pPVar2;
  Part_One_t *p2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Part_Man_t *pMan_00;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *p;
  Part_One_t *pPVar9;
  uint *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong local_40;
  
  pVVar6 = pMan->vCis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      *(long *)pVVar6->pArray[lVar5] = lVar5;
      lVar5 = lVar5 + 1;
      pVVar6 = pMan->vCis;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = pMan->vCos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      *(long *)pVVar6->pArray[lVar5] = lVar5;
      lVar5 = lVar5 + 1;
      pVVar6 = pMan->vCos;
    } while (lVar5 < pVVar6->nSize);
  }
  pMan_00 = Part_ManStart(0x100000,0x40);
  uVar13 = pMan->nObjs[3];
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  local_40 = 8;
  if (6 < uVar13 - 1) {
    local_40 = (ulong)uVar13;
  }
  pVVar6->nSize = 0;
  iVar11 = (int)local_40;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar6->pArray = ppvVar7;
  Aig_ManCleanData(pMan);
  pVVar8 = pMan->vObjs;
  if (0 < pVVar8->nSize) {
    iVar11 = 0;
    lVar5 = 0;
    do {
      puVar1 = (uint *)pVVar8->pArray[lVar5];
      if (puVar1 != (uint *)0x0) {
        uVar13 = (uint)*(undefined8 *)(puVar1 + 6);
        if ((uVar13 & 7) - 7 < 0xfffffffe) {
          uVar3 = uVar13 & 7;
          if (uVar3 == 2) {
            if (0x3f < uVar13) {
              puVar10 = (uint *)Part_ManFetch(pMan_00,0x10);
              *puVar10 = uVar13 >> 6;
              puVar10[1] = 0;
              puVar10[2] = 1;
              uVar13 = *puVar1;
              puVar10[1] = 1;
              puVar10[3] = uVar13;
LAB_006c55c5:
              *(uint **)(puVar1 + 10) = puVar10;
            }
          }
          else if (uVar3 == 3) {
            pPVar2 = *(Part_One_t **)((*(ulong *)(puVar1 + 2) & 0xfffffffffffffffe) + 0x28);
            p = Part_ManTransferEntry(pPVar2);
            Vec_IntPush(p,*puVar1);
            iVar12 = (int)local_40;
            if (iVar11 == iVar12) {
              if (iVar12 < 0x10) {
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
                }
                pVVar6->pArray = ppvVar7;
                pVVar6->nCap = 0x10;
                local_40 = 0x10;
              }
              else {
                local_40 = (ulong)(uint)(iVar12 * 2);
                if (pVVar6->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(local_40 * 8);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar6->pArray,local_40 * 8);
                }
                pVVar6->pArray = ppvVar7;
                pVVar6->nCap = iVar12 * 2;
              }
            }
            else {
              ppvVar7 = pVVar6->pArray;
            }
            iVar12 = iVar11 + 1;
            pVVar6->nSize = iVar12;
            ppvVar7[iVar11] = p;
            if (pPVar2->nRefs < 1) {
              __assert_fail("pPart0->nRefs > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0x13a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
            }
            iVar4 = pPVar2->nRefs + -1;
            pPVar2->nRefs = iVar4;
            iVar11 = iVar12;
            if (iVar4 == 0) {
              iVar12 = pPVar2->nOutsAlloc;
              if (iVar12 < pPVar2->nOuts) goto LAB_006c579c;
              if (pPVar2->nOuts < iVar12 / 2) goto LAB_006c577d;
              Part_ManRecycle(pMan_00,(char *)pPVar2,iVar12 * 4 + 0xc);
            }
          }
          else {
            if (((ulong)puVar1 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar3 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0x14f,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
            }
            if (0x3f < uVar13) {
              puVar10 = (uint *)Part_ManFetch(pMan_00,0xc);
              *puVar10 = uVar13 >> 6;
              puVar10[1] = 0;
              puVar10[2] = 0;
              goto LAB_006c55c5;
            }
          }
        }
        else {
          pPVar2 = *(Part_One_t **)((*(ulong *)(puVar1 + 2) & 0xfffffffffffffffe) + 0x28);
          p2 = *(Part_One_t **)((*(ulong *)(puVar1 + 4) & 0xfffffffffffffffe) + 0x28);
          pPVar9 = Part_ManMergeEntry(pMan_00,pPVar2,p2,uVar13 >> 6);
          *(Part_One_t **)(puVar1 + 10) = pPVar9;
          if (pPVar2->nRefs < 1) {
            __assert_fail("pPart0->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x12a,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
          iVar12 = pPVar2->nRefs + -1;
          pPVar2->nRefs = iVar12;
          if (iVar12 == 0) {
            iVar12 = pPVar2->nOutsAlloc;
            if (iVar12 < pPVar2->nOuts) goto LAB_006c579c;
            if (pPVar2->nOuts < iVar12 / 2) goto LAB_006c577d;
            Part_ManRecycle(pMan_00,(char *)pPVar2,iVar12 * 4 + 0xc);
          }
          if (p2->nRefs < 1) {
            __assert_fail("pPart1->nRefs > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                          ,0x12d,"Vec_Ptr_t *Aig_ManSupports(Aig_Man_t *)");
          }
          iVar12 = p2->nRefs + -1;
          p2->nRefs = iVar12;
          if (iVar12 == 0) {
            iVar12 = p2->nOutsAlloc;
            if (iVar12 < p2->nOuts) {
LAB_006c579c:
              __assert_fail("pEntry->nOuts <= pEntry->nOutsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0xc4,"void Part_ManRecycleEntry(Part_Man_t *, Part_One_t *)");
            }
            if (p2->nOuts < iVar12 / 2) {
LAB_006c577d:
              __assert_fail("pEntry->nOuts >= pEntry->nOutsAlloc/2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                            ,0xc5,"void Part_ManRecycleEntry(Part_Man_t *, Part_One_t *)");
            }
            Part_ManRecycle(pMan_00,(char *)p2,iVar12 * 4 + 0xc);
          }
        }
      }
      lVar5 = lVar5 + 1;
      pVVar8 = pMan->vObjs;
    } while (lVar5 < pVVar8->nSize);
  }
  Part_ManStop(pMan_00);
  qsort(pVVar6->pArray,(long)pVVar6->nSize,8,Vec_VecSortCompare2);
  pVVar8 = pMan->vCis;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      *(undefined8 *)pVVar8->pArray[lVar5] = 0;
      lVar5 = lVar5 + 1;
      pVVar8 = pMan->vCis;
    } while (lVar5 < pVVar8->nSize);
  }
  pVVar8 = pMan->vCos;
  if (0 < pVVar8->nSize) {
    lVar5 = 0;
    do {
      *(undefined8 *)pVVar8->pArray[lVar5] = 0;
      lVar5 = lVar5 + 1;
      pVVar8 = pMan->vCos;
    } while (lVar5 < pVVar8->nSize);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Aig_ManSupports( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupports;
    Vec_Int_t * vSupp;
    Part_Man_t * p;
    Part_One_t * pPart0, * pPart1;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    // set the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = (Aig_Obj_t *)(long)i;
    // start the support computation manager
    p = Part_ManStart( 1 << 20, 1 << 6 );
    // consider objects in the topological order
    vSupports = Vec_PtrAlloc( Aig_ManCoNum(pMan) );
    Aig_ManCleanData(pMan);
    Aig_ManForEachObj( pMan, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            pPart1 = (Part_One_t *)Aig_ObjFanin1(pObj)->pData;
            pObj->pData = Part_ManMergeEntry( p, pPart0, pPart1, pObj->nRefs );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            assert( pPart1->nRefs > 0 );
            if ( --pPart1->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart1 );
            if ( ((Part_One_t *)pObj->pData)->nOuts <= 16 )
                Counter++;
            continue;
        }
        if ( Aig_ObjIsCo(pObj) )
        {
            pPart0 = (Part_One_t *)Aig_ObjFanin0(pObj)->pData;
            vSupp = Part_ManTransferEntry(pPart0);
            Vec_IntPush( vSupp, (int)(long)pObj->pNext );
            Vec_PtrPush( vSupports, vSupp );
            assert( pPart0->nRefs > 0 );
            if ( --pPart0->nRefs == 0 )
                Part_ManRecycleEntry( p, pPart0 );
            continue;
        }
        if ( Aig_ObjIsCi(pObj) )
        {
            if ( pObj->nRefs )
            {
                pPart0 = Part_ManFetchEntry( p, 1, pObj->nRefs );
                pPart0->pOuts[ pPart0->nOuts++ ] = (int)(long)pObj->pNext;
                pObj->pData = pPart0;
            }
            continue;
        }
        if ( Aig_ObjIsConst1(pObj) )
        {
            if ( pObj->nRefs )
                pObj->pData = Part_ManFetchEntry( p, 0, pObj->nRefs );
            continue;
        }
        assert( 0 );
    }
//printf( "Memory usage = %d MB.\n", Vec_PtrSize(p->vMemory) * p->nChunkSize / (1<<20) );
    Part_ManStop( p );
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
    // clear the number of PIs/POs
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pNext = NULL;
    Aig_ManForEachCo( pMan, pObj, i )
        pObj->pNext = NULL;
/*
    Aig_ManForEachCo( pMan, pObj, i )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vSupports, i) ) );
    printf( "\n" );
*/
//    printf( "%d \n", Counter );
    return vSupports;
}